

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

void __thiscall r_exec::TPX::TPX(TPX *this,AutoFocusController *auto_focus,_Fact *target)

{
  atomic_int_fast64_t *paVar1;
  BindingMap *this_00;
  Code *c;
  P<r_exec::BindingMap> bm;
  
  (this->super__Object).refCount.super___atomic_base<long>._M_i = 0;
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__TPX_001d2c00;
  this->auto_focus = auto_focus;
  (this->target).object = (_Object *)0x0;
  (this->target_bindings).object = (_Object *)0x0;
  (this->abstracted_target).object = (_Object *)0x0;
  (this->cst_hook).object = (_Object *)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  bm.object = (_Object *)this_00;
  c = BindingMap::abstract_object(this_00,(Code *)target,false);
  core::P<r_exec::_Fact>::operator=(&this->abstracted_target,(_Fact *)c);
  core::P<r_exec::_Fact>::operator=(&this->target,target);
  core::P<r_exec::BindingMap>::operator=(&this->target_bindings,this_00);
  core::P<r_exec::BindingMap>::~P(&bm);
  return;
}

Assistant:

TPX::TPX(AutoFocusController *auto_focus, _Fact *target): _Object(), auto_focus(auto_focus)   // called by CTPX's ctor.
{
    P<BindingMap> bm = new BindingMap();
    abstracted_target = (_Fact *)bm->abstract_object(target, false);
    this->target = target;
    target_bindings = bm;
}